

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handle.cpp
# Opt level: O1

Region * __thiscall
remote::Handle::GetRegionByAddress(Region *__return_storage_ptr__,Handle *this,size_t address)

{
  pointer pcVar1;
  bool bVar2;
  pointer pRVar3;
  vector<remote::Region,_std::allocator<remote::Region>_> regions;
  Region reg;
  vector<remote::Region,_std::allocator<remote::Region>_> local_c0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  size_t local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (__return_storage_ptr__->pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pathname).field_2;
  (__return_storage_ptr__->pathname)._M_string_length = 0;
  (__return_storage_ptr__->pathname).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->filename)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename).field_2;
  __return_storage_ptr__->start = 0;
  __return_storage_ptr__->end = 0;
  __return_storage_ptr__->read = false;
  __return_storage_ptr__->write = false;
  __return_storage_ptr__->exec = false;
  __return_storage_ptr__->shared = false;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->deviceMajor = 0;
  __return_storage_ptr__->deviceMinor = 0;
  __return_storage_ptr__->inodeFileNumber = 0;
  (__return_storage_ptr__->filename)._M_string_length = 0;
  (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  if (this->pid != -1) {
    bVar2 = IsRunning(this);
    if (bVar2) {
      remote::GetRegions(&local_c0,this->pid);
      if (local_c0.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_c0.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pRVar3 = local_c0.super__Vector_base<remote::Region,_std::allocator<remote::Region>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          local_78 = pRVar3->inodeFileNumber;
          local_a8 = (undefined4)pRVar3->start;
          uStack_a4 = *(undefined4 *)((long)&pRVar3->start + 4);
          uStack_a0 = (undefined4)pRVar3->end;
          uStack_9c = *(undefined4 *)((long)&pRVar3->end + 4);
          local_98._0_1_ = pRVar3->read;
          local_98._1_1_ = pRVar3->write;
          local_98._2_1_ = pRVar3->exec;
          local_98._3_1_ = pRVar3->shared;
          uStack_94 = *(undefined4 *)&pRVar3->field_0x14;
          uStack_90 = (undefined4)pRVar3->offset;
          uStack_8c = *(undefined4 *)((long)&pRVar3->offset + 4);
          local_88 = (undefined4)pRVar3->deviceMajor;
          uStack_84 = *(undefined4 *)((long)&pRVar3->deviceMajor + 4);
          uStack_80 = (undefined4)pRVar3->deviceMinor;
          uStack_7c = *(undefined4 *)((long)&pRVar3->deviceMinor + 4);
          pcVar1 = (pRVar3->pathname)._M_dataplus._M_p;
          local_70[0] = local_60;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_70,pcVar1,pcVar1 + (pRVar3->pathname)._M_string_length);
          pcVar1 = (pRVar3->filename)._M_dataplus._M_p;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,pcVar1,pcVar1 + (pRVar3->filename)._M_string_length);
          if ((address <= CONCAT44(uStack_a4,local_a8)) &&
             (address <= CONCAT44(uStack_9c,uStack_a0))) {
            __return_storage_ptr__->inodeFileNumber = local_78;
            __return_storage_ptr__->deviceMajor = CONCAT44(uStack_84,local_88);
            __return_storage_ptr__->deviceMinor = CONCAT44(uStack_7c,uStack_80);
            __return_storage_ptr__->read = (bool)(char)local_98;
            __return_storage_ptr__->write = (bool)(char)((uint)local_98 >> 8);
            __return_storage_ptr__->exec = (bool)(char)((uint)local_98 >> 0x10);
            __return_storage_ptr__->shared = (bool)(char)((uint)local_98 >> 0x18);
            *(undefined4 *)&__return_storage_ptr__->field_0x14 = uStack_94;
            __return_storage_ptr__->offset = CONCAT44(uStack_8c,uStack_90);
            __return_storage_ptr__->start = CONCAT44(uStack_a4,local_a8);
            __return_storage_ptr__->end = CONCAT44(uStack_9c,uStack_a0);
            std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->pathname);
            std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->filename);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          if (local_70[0] != local_60) {
            operator_delete(local_70[0]);
          }
          pRVar3 = pRVar3 + 1;
        } while (pRVar3 != local_c0.
                           super__Vector_base<remote::Region,_std::allocator<remote::Region>_>.
                           _M_impl.super__Vector_impl_data._M_finish);
      }
      std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector(&local_c0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Region Handle::GetRegionByAddress(size_t address) {
    Region r;

    if(IsValid() && IsRunning()) {
        vector<Region> regions = GetRegions();

        for(auto reg : regions) {
            if(reg.start >= address && address <= reg.end) {
                r = reg;
            }
        }
    }

    return r;
}